

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O2

PTR brynet::net::TcpService::Create(void)

{
  TcpService *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  PTR PVar3;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>
  local_49;
  TcpService *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  peVar2 = (element_type *)operator_new(0xa0);
  local_38._M_alloc = &local_49;
  (peVar2->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar2->_vptr_TcpService = (_func_int **)&PTR___Sp_counted_ptr_inplace_00154b38;
  this = (TcpService *)
         &(peVar2->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
          super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  memset(this,0,0x90);
  TcpService(this);
  local_38._M_ptr = (pointer)0x0;
  (peVar2->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__TcpService_00154b88;
  local_48 = this;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<make_shared_enabler,_std::allocator<make_shared_enabler>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  std::__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>::_M_assign
            ((__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
             &peVar2->mIOLoopDatas,this,&_Stack_40);
  _Var1._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_TcpService = (_func_int **)local_48;
  (in_RDI->super_enable_shared_from_this<brynet::net::TcpService>)._M_weak_this.
  super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_48 = (TcpService *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  PVar3.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PTR)PVar3.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpService::PTR TcpService::Create()
{
    struct make_shared_enabler : public TcpService {};
    return std::make_shared<make_shared_enabler>();
}